

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void make_native(Vm *vm,char *name,size_t length,void *fn_ptr,uint8_t num_params,_Bool pass_vm)

{
  uint32_t uVar1;
  ObjNativeFunc *object;
  uint8_t instruction;
  CrispyValue CVar2;
  CrispyValue value;
  VarHTItemKey key;
  Variable value_00;
  
  object = new_native_func(vm,fn_ptr,num_params,pass_vm);
  CVar2 = create_object(&object->object);
  value.field_1 = CVar2.field_1;
  value._4_4_ = 0;
  value.type = CVar2.type;
  uVar1 = add_constant(vm,value);
  if ((uVar1 & 0xff00) == 0) {
    instruction = '\x12';
  }
  else {
    instruction = (uint8_t)(uVar1 >> 8);
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x13');
  }
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,instruction);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,(uint8_t)uVar1);
  uVar1 = (vm->compiler).vars_in_scope;
  (vm->compiler).vars_in_scope = uVar1 + 1;
  value_00.scope = (vm->compiler).scope_depth;
  value_00.index = uVar1;
  key.ident_length = length;
  key.key_ident_string = name;
  value_00.frame_offset = vm->frame_count;
  value_00._12_4_ = 0;
  var_ht_put((vm->compiler).scope,key,value_00);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x16');
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,(uint8_t)uVar1);
  return;
}

Assistant:

static void make_native(Vm *vm, const char *name, size_t length, void *fn_ptr, uint8_t num_params, bool pass_vm) {
    ObjNativeFunc *native_func = new_native_func(vm, fn_ptr, num_params, pass_vm);
    CrispyValue value = create_object((Object *) native_func);

    uint16_t pos = (uint16_t) add_constant(vm, value);

    if (pos > UINT8_MAX) {
        uint8_t index_1 = (uint8_t) (pos >> 8);
        uint8_t index_2 = (uint8_t) (pos & 0xFF);
        emit_short_arg(vm, OP_LDC_W, index_1, index_2);
    } else {
        emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
    }

    Variable variable = {vm->compiler.vars_in_scope++, vm->compiler.scope_depth, (int) vm->frame_count, false};
    VarHTItemKey key = {name, length};
    var_ht_put(&vm->compiler.scope[0], key, variable);
    emit_byte_arg(vm, OP_STORE, (uint8_t) variable.index);

    // TODO if first statement in interactive mode causes an error: this bytecode will never be executed and any access segfaults
}